

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_estimateCDictSize_advanced
                 (size_t dictSize,ZSTD_compressionParameters cParams,
                 ZSTD_dictLoadMethod_e dictLoadMethod)

{
  long lVar1;
  long lVar2;
  
  lVar2 = 0;
  if (cParams.strategy != ZSTD_fast) {
    lVar2 = 1L << ((byte)cParams.chainLog & 0x3f);
  }
  lVar1 = dictSize + 0x2b0c;
  if (dictLoadMethod == ZSTD_dlm_byRef) {
    lVar1 = 0x2b0c;
  }
  return lVar1 + ((1L << ((byte)cParams.hashLog & 0x3f)) + lVar2) * 4;
}

Assistant:

size_t ZSTD_estimateCDictSize_advanced(
        size_t dictSize, ZSTD_compressionParameters cParams,
        ZSTD_dictLoadMethod_e dictLoadMethod)
{
    DEBUGLOG(5, "sizeof(ZSTD_CDict) : %u", (unsigned)sizeof(ZSTD_CDict));
    return sizeof(ZSTD_CDict) + HUF_WORKSPACE_SIZE + ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 0)
           + (dictLoadMethod == ZSTD_dlm_byRef ? 0 : dictSize);
}